

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
__thiscall
duckdb::ParquetWriteInitializeGlobal
          (duckdb *this,ClientContext *context,FunctionData *bind_data,string *file_path)

{
  ParquetWriter *pPVar1;
  pointer pPVar2;
  pointer *__ptr;
  ParquetWriter *local_68;
  _Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_*,_false>
  local_60;
  _Head_base<0UL,_duckdb::ParquetWriteGlobalState_*,_false> local_58;
  __uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  local_50;
  FunctionData *local_48;
  FileSystem *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_58._M_head_impl = (ParquetWriteGlobalState *)operator_new(0x40);
  ((local_58._M_head_impl)->super_GlobalFunctionData)._vptr_GlobalFunctionData =
       (_func_int **)&PTR__ParquetWriteGlobalState_0247aae8;
  ((local_58._M_head_impl)->writer).
  super_unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetWriter_*,_std::default_delete<duckdb::ParquetWriter>_>.
  super__Head_base<0UL,_duckdb::ParquetWriter_*,_false> =
       (_Head_base<0UL,_duckdb::ParquetWriter_*,_false>)0x0;
  ((local_58._M_head_impl)->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&((local_58._M_head_impl)->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&((local_58._M_head_impl)->lock).super___mutex_base._M_mutex + 0x10) = 0;
  ((local_58._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  ((local_58._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ((local_58._M_head_impl)->combine_buffer).
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> =
       (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)0x0;
  local_40 = FileSystem::GetFileSystem(context);
  local_50._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>)
       (tuple<duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>)this;
  local_38 = file_path;
  ChildFieldIDs::Copy((ChildFieldIDs *)&local_60);
  local_48 = bind_data + 10;
  make_uniq<duckdb::ParquetWriter,duckdb::ClientContext&,duckdb::FileSystem&,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb_parquet::CompressionCodec::type&,duckdb::ChildFieldIDs,duckdb::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,true>&,duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>&,unsigned_long&,unsigned_long&,double&,long&,bool&,duckdb::ParquetVersion&>
            ((duckdb *)&local_68,context,local_40,local_38,
             (vector<duckdb::LogicalType,_true> *)(bind_data + 4),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(bind_data + 7),(type *)local_48,(ChildFieldIDs *)&local_60,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)(bind_data + 0xb),
             (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)(bind_data + 0x10),
             (unsigned_long *)(bind_data + 0x13),(unsigned_long *)(bind_data + 0x14),
             (double *)(bind_data + 0x15),(long *)(bind_data + 0x18),(bool *)(bind_data + 0x12),
             (ParquetVersion *)(bind_data + 0x19));
  pPVar2 = unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
                         *)&local_58);
  pPVar1 = local_68;
  local_68 = (ParquetWriter *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_>::reset
            ((__uniq_ptr_impl<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_> *)
             &pPVar2->writer,pPVar1);
  pPVar1 = local_68;
  if (local_68 != (ParquetWriter *)0x0) {
    ParquetWriter::~ParquetWriter(local_68);
    operator_delete(pPVar1);
  }
  local_68 = (ParquetWriter *)0x0;
  if (&(local_60._M_head_impl)->_M_h !=
      (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(local_60._M_head_impl)->_M_h);
    operator_delete(local_60._M_head_impl);
  }
  *(ParquetWriteGlobalState **)
   local_50._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
   .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl = local_58._M_head_impl;
  return (unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
          )local_50._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
           .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalFunctionData> ParquetWriteInitializeGlobal(ClientContext &context, FunctionData &bind_data,
                                                            const string &file_path) {
	auto global_state = make_uniq<ParquetWriteGlobalState>();
	auto &parquet_bind = bind_data.Cast<ParquetWriteBindData>();

	auto &fs = FileSystem::GetFileSystem(context);
	global_state->writer = make_uniq<ParquetWriter>(
	    context, fs, file_path, parquet_bind.sql_types, parquet_bind.column_names, parquet_bind.codec,
	    parquet_bind.field_ids.Copy(), parquet_bind.kv_metadata, parquet_bind.encryption_config,
	    parquet_bind.dictionary_size_limit, parquet_bind.string_dictionary_page_size_limit,
	    parquet_bind.bloom_filter_false_positive_ratio, parquet_bind.compression_level, parquet_bind.debug_use_openssl,
	    parquet_bind.parquet_version);
	return std::move(global_state);
}